

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::convert_row_major_matrix
          (CompilerGLSL *this,string *exp_str,SPIRType *exp_type,uint32_t param_3,bool param_4)

{
  bool bVar1;
  long lVar2;
  CompilerError *this_00;
  undefined4 in_register_0000000c;
  SPIRType *type;
  allocator local_d9;
  string local_d8 [38];
  char local_b2 [2];
  spirv_cross local_b0 [36];
  uint local_8c;
  undefined1 local_88 [4];
  uint32_t c;
  undefined1 local_65;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> column_expr;
  size_type column_index;
  bool param_4_local;
  uint32_t param_3_local;
  SPIRType *exp_type_local;
  string *exp_str_local;
  CompilerGLSL *this_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *transposed_expr;
  
  type = (SPIRType *)CONCAT44(in_register_0000000c,param_3);
  strip_enclosed_expression((CompilerGLSL *)exp_str,(string *)exp_type);
  bVar1 = Compiler::is_matrix((Compiler *)exp_str,type);
  if (bVar1) {
    if (*(uint *)(exp_str + 0x1dd4) < 0x78) {
      if ((type->vecsize == 2) && (type->columns == 2)) {
        if (((byte)exp_str[0x24a4] & 1) == 0) {
          exp_str[0x24a4] = (string)0x1;
          Compiler::force_recompile((Compiler *)exp_str);
        }
      }
      else if ((type->vecsize == 3) && (type->columns == 3)) {
        if (((byte)exp_str[0x24a5] & 1) == 0) {
          exp_str[0x24a5] = (string)0x1;
          Compiler::force_recompile((Compiler *)exp_str);
        }
      }
      else {
        if ((type->vecsize != 4) || (type->columns != 4)) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_d8,
                     "Non-square matrices are not supported in legacy GLSL, cannot transpose.",
                     &local_d9);
          CompilerError::CompilerError(this_00,(string *)local_d8);
          __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (((byte)exp_str[0x24a6] & 1) == 0) {
          exp_str[0x24a6] = (string)0x1;
          Compiler::force_recompile((Compiler *)exp_str);
        }
      }
      join<char_const(&)[14],std::__cxx11::string&,char_const(&)[2]>
                ((spirv_cross *)this,(char (*) [14])"spvTranspose(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)exp_type,
                 (char (*) [2])0x5b48c4);
    }
    else {
      join<char_const(&)[11],std::__cxx11::string&,char_const(&)[2]>
                ((spirv_cross *)this,(char (*) [11])0x5bf1ea,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)exp_type,
                 (char (*) [2])0x5b48c4);
    }
  }
  else {
    lVar2 = ::std::__cxx11::string::find_last_of((char)exp_type,0x5b);
    if (lVar2 == -1) {
      ::std::__cxx11::string::string((string *)this,(string *)exp_type);
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_58,(ulong)exp_type);
      ::std::__cxx11::string::resize((ulong)exp_type);
      local_65 = 0;
      type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_88,(SPIRType *)exp_str);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       local_88);
      ::std::__cxx11::string::~string((string *)local_88);
      for (local_8c = 0; local_8c < type->vecsize; local_8c = local_8c + 1) {
        local_b2[1] = 0x5b;
        local_b2[0] = ']';
        join<std::__cxx11::string&,char,unsigned_int&,char,std::__cxx11::string&>
                  (local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            exp_type,local_b2 + 1,&local_8c,local_b2,local_58);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_b0);
        ::std::__cxx11::string::~string((string *)local_b0);
        if (local_8c + 1 < type->vecsize) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
      ::std::__cxx11::string::operator+=((string *)this,")");
      local_65 = 1;
      ::std::__cxx11::string::~string((string *)local_58);
    }
  }
  return this;
}

Assistant:

string CompilerGLSL::convert_row_major_matrix(string exp_str, const SPIRType &exp_type, uint32_t /* physical_type_id */,
                                              bool /*is_packed*/)
{
	strip_enclosed_expression(exp_str);
	if (!is_matrix(exp_type))
	{
		auto column_index = exp_str.find_last_of('[');
		if (column_index == string::npos)
			return exp_str;

		auto column_expr = exp_str.substr(column_index);
		exp_str.resize(column_index);

		auto transposed_expr = type_to_glsl_constructor(exp_type) + "(";

		// Loading a column from a row-major matrix. Unroll the load.
		for (uint32_t c = 0; c < exp_type.vecsize; c++)
		{
			transposed_expr += join(exp_str, '[', c, ']', column_expr);
			if (c + 1 < exp_type.vecsize)
				transposed_expr += ", ";
		}

		transposed_expr += ")";
		return transposed_expr;
	}
	else if (options.version < 120)
	{
		// GLSL 110, ES 100 do not have transpose(), so emulate it.  Note that
		// these GLSL versions do not support non-square matrices.
		if (exp_type.vecsize == 2 && exp_type.columns == 2)
		{
			if (!requires_transpose_2x2)
			{
				requires_transpose_2x2 = true;
				force_recompile();
			}
		}
		else if (exp_type.vecsize == 3 && exp_type.columns == 3)
		{
			if (!requires_transpose_3x3)
			{
				requires_transpose_3x3 = true;
				force_recompile();
			}
		}
		else if (exp_type.vecsize == 4 && exp_type.columns == 4)
		{
			if (!requires_transpose_4x4)
			{
				requires_transpose_4x4 = true;
				force_recompile();
			}
		}
		else
			SPIRV_CROSS_THROW("Non-square matrices are not supported in legacy GLSL, cannot transpose.");
		return join("spvTranspose(", exp_str, ")");
	}
	else
		return join("transpose(", exp_str, ")");
}